

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.cc
# Opt level: O2

void __thiscall
gimage::HighDynamicRangeFusionBase::setContrastWeight
          (HighDynamicRangeFusionBase *this,ImageFloat *wp,ImageFloat *lp,float max_value)

{
  uint uVar1;
  ulong uVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long i;
  ulong uVar7;
  int d;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  uVar1 = lp->depth;
  pfVar3 = **wp->img;
  uVar5 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar5;
  }
  uVar6 = lp->width;
  if (lp->width < 1) {
    uVar6 = uVar5;
  }
  uVar4 = lp->height;
  if (lp->height < 1) {
    uVar4 = uVar5;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      fVar9 = 0.0;
      for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
        fVar9 = fVar9 + lp->img[uVar8][uVar5][uVar7];
      }
      fVar10 = -fVar9;
      if (-fVar9 <= fVar9) {
        fVar10 = fVar9;
      }
      *pfVar3 = fVar10 * ((1.0 / max_value) / (float)(int)uVar1);
      pfVar3 = pfVar3 + 1;
    }
  }
  return;
}

Assistant:

void HighDynamicRangeFusionBase::setContrastWeight(ImageFloat &wp, const ImageFloat &lp,
  float max_value)
{
  float scale=1.0f/max_value/lp.getDepth();

  float *p=wp.getPtr(0, 0, 0);
  for (long k=0; k<lp.getHeight(); k++)
  {
    for (long i=0; i<lp.getWidth(); i++)
    {
      float v=0;
      for (int d=0; d<lp.getDepth(); d++)
      {
        v+=lp.get(i, k, d);
      }

      // use absolute value of laplacian as measure for contrast

      if (v < 0) v=-v;

      *p++ = scale*v;
    }
  }
}